

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError PaAlsaStream_EndProcessing(PaAlsaStream *self,unsigned_long numFrames,int *xrunOccurred)

{
  int *in_RDX;
  unsigned_long in_RSI;
  long in_RDI;
  int xrun;
  PaError result;
  PaUtilBufferProcessor *in_stack_00000028;
  PaAlsaStreamComponent *in_stack_00000030;
  int local_20;
  PaError local_1c;
  int *local_18;
  unsigned_long local_10;
  long local_8;
  
  local_1c = 0;
  local_20 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if ((*(long *)(in_RDI + 0x2c0) == 0) ||
     (paUtilErr_ = PaAlsaStreamComponent_EndProcessing
                             ((PaAlsaStreamComponent *)(in_RDI + 0x288),in_RSI,&local_20),
     -1 < paUtilErr_)) {
    if (*(long *)(local_8 + 0x340) != 0) {
      if ((*(int *)(local_8 + 0x310) < *(int *)(local_8 + 0x314)) &&
         (paUtilErr_ = PaAlsaStreamComponent_DoChannelAdaption
                                 (in_stack_00000030,in_stack_00000028,self._4_4_), paUtilErr_ < 0))
      {
        PaUtil_DebugPrint(
                         "Expression \'PaAlsaStreamComponent_DoChannelAdaption( &self->playback, &self->bufferProcessor, numFrames )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3594\n"
                         );
        local_1c = paUtilErr_;
      }
      else {
        paUtilErr_ = PaAlsaStreamComponent_EndProcessing
                               ((PaAlsaStreamComponent *)(local_8 + 0x308),local_10,&local_20);
        if (paUtilErr_ < 0) {
          PaUtil_DebugPrint(
                           "Expression \'PaAlsaStreamComponent_EndProcessing( &self->playback, numFrames, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3596\n"
                           );
          local_1c = paUtilErr_;
        }
      }
    }
  }
  else {
    PaUtil_DebugPrint(
                     "Expression \'PaAlsaStreamComponent_EndProcessing( &self->capture, numFrames, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3588\n"
                     );
    local_1c = paUtilErr_;
  }
  *local_18 = local_20;
  return local_1c;
}

Assistant:

static PaError PaAlsaStream_EndProcessing( PaAlsaStream *self, unsigned long numFrames, int *xrunOccurred )
{
    PaError result = paNoError;
    int xrun = 0;

    if( self->capture.pcm )
    {
        PA_ENSURE( PaAlsaStreamComponent_EndProcessing( &self->capture, numFrames, &xrun ) );
    }
    if( self->playback.pcm )
    {
        if( self->playback.numHostChannels > self->playback.numUserChannels )
        {
            PA_ENSURE( PaAlsaStreamComponent_DoChannelAdaption( &self->playback, &self->bufferProcessor, numFrames ) );
        }
        PA_ENSURE( PaAlsaStreamComponent_EndProcessing( &self->playback, numFrames, &xrun ) );
    }

error:
    *xrunOccurred = xrun;
    return result;
}